

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManComputeBackward1(Of_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  Of_Obj_t *pOVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pObj;
  int *pCutSet;
  ulong uVar6;
  int k;
  uint uVar7;
  int iVar8;
  uint v;
  uint *pCut;
  int Cost;
  int iVar9;
  int iVar10;
  uint *local_50;
  
  iVar1 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,1);
  pJVar2 = p->pPars;
  pJVar2->Area = 0;
  pJVar2->Edge = 0;
  v = p->pGia->nObjs;
  do {
    do {
      while( true ) {
        do {
          if ((int)v < 2) {
            return;
          }
          v = v - 1;
          pObj = Gia_ManObj(p->pGia,v);
          if (pObj == (Gia_Obj_t *)0x0) {
            return;
          }
          uVar5 = (uint)*(undefined8 *)pObj;
        } while ((~uVar5 & 0x1fffffff) == 0 || (int)uVar5 < 0);
        pOVar3 = p->pObjs;
        iVar10 = pOVar3[v].Required;
        iVar4 = Gia_ObjIsBuf(pObj);
        if (iVar4 == 0) break;
        iVar4 = v - (uVar5 & 0x1fffffff);
        if (iVar10 < pOVar3[iVar4].Required) {
          pOVar3[iVar4].Required = iVar10;
        }
        pOVar3[iVar4].nRefs = pOVar3[iVar4].nRefs + 1;
      }
    } while (pOVar3[v].nRefs == 0);
    pCutSet = Of_ObjCutSet(p,v);
    pCut = (uint *)(pCutSet + 1);
    local_50 = (uint *)0x0;
    iVar4 = 1000000000;
    for (iVar8 = 0; iVar8 < *pCutSet; iVar8 = iVar8 + 1) {
      uVar5 = *pCut;
      uVar6 = (ulong)(uVar5 & 0x1f);
      if ((int)pCut[uVar6 + 1] <= iVar10) {
        iVar9 = 0;
        for (uVar7 = 0; uVar5 = uVar5 & 0x1f, uVar7 < uVar5; uVar7 = uVar7 + 1) {
          uVar5 = Of_CutVar((int *)pCut,uVar7);
          if (uVar5 == 0) {
            uVar5 = *pCut & 0x1f;
            break;
          }
          if (p->pObjs[uVar5].nRefs == 0) {
            iVar9 = iVar9 + p->pObjs[uVar5].Flow;
          }
          uVar5 = *pCut;
        }
        if (iVar9 < iVar4) {
          local_50 = pCut;
        }
        if (iVar9 <= iVar4) {
          iVar4 = iVar9;
        }
        uVar6 = (ulong)uVar5;
      }
      pCut = pCut + uVar6 + 4;
    }
    if (local_50 == (uint *)0x0) {
      __assert_fail("pCutMin != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                    ,0x4b2,"void Of_ManComputeBackward1(Of_Man_t *)");
    }
    Of_ObjSetCutBestP(p,pCutSet,v,(int *)local_50);
    iVar10 = iVar10 - iVar1;
    for (uVar5 = 0; uVar7 = *local_50 & 0x1f, uVar5 < uVar7; uVar5 = uVar5 + 1) {
      uVar7 = Of_CutVar((int *)local_50,uVar5);
      if (uVar7 == 0) {
        uVar7 = *local_50 & 0x1f;
        break;
      }
      pOVar3 = p->pObjs;
      if (iVar10 < pOVar3[uVar7].Required) {
        pOVar3[uVar7].Required = iVar10;
      }
      pOVar3[uVar7].nRefs = pOVar3[uVar7].nRefs + 1;
    }
    pJVar2 = p->pPars;
    pJVar2->Area = pJVar2->Area + 1;
    pJVar2->Edge = (ulong)uVar7 + pJVar2->Edge;
  } while( true );
}

Assistant:

void Of_ManComputeBackward1( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    Of_ManComputeOutputRequired( p, 1 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            Of_ObjRefInc( p, FaninId );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_ManComputeBackwardCut( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
        {
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
            Of_ObjRefInc( p, iVar );
        }
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}